

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O2

bool __thiscall
solitaire::events::EventsProcessor::checkIfCollidesAndTryClickButtons
          (EventsProcessor *this,MouseLeftButtonDown *event)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _func_int **pp_Var3;
  long lStack_20;
  
  iVar2 = (*this->context->_vptr_Context[0xc])();
  cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))
                    ((long *)CONCAT44(extraout_var,iVar2),event);
  pp_Var3 = this->context->_vptr_Context;
  if (cVar1 == '\0') {
    iVar2 = (*pp_Var3[0xe])();
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x18))
                      ((long *)CONCAT44(extraout_var_00,iVar2),event);
    if (cVar1 == '\0') {
      return false;
    }
    pp_Var3 = this->context->_vptr_Context;
    lStack_20 = 0x18;
  }
  else {
    lStack_20 = 0x10;
  }
  iVar2 = (*pp_Var3[4])();
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + lStack_20))
            ((long *)CONCAT44(extraout_var_01,iVar2));
  return true;
}

Assistant:

bool EventsProcessor::checkIfCollidesAndTryClickButtons(
    const MouseLeftButtonDown& event) const
{
    if (context.getNewGameButton().collidesWith(event.position)) {
        context.getSolitaire().startNewGame();
        return true;
    }
    if (context.getUndoButton().collidesWith(event.position)) {
        context.getSolitaire().tryUndoOperation();
        return true;
    }
    return false;
}